

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O3

char * upb_MtDecoder_Parse(upb_MtDecoder *d,char *ptr,size_t len,void *fields,size_t field_size,
                          uint16_t *field_count,upb_SubCounts *sub_counts)

{
  uint8_t *puVar1;
  upb_MiniTable *puVar2;
  undefined1 *puVar3;
  byte bVar4;
  byte *pbVar5;
  upb_MiniTableField *puVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint *puVar11;
  uint16_t uVar12;
  uint uVar13;
  uint *puVar14;
  ulong uVar15;
  char cVar16;
  byte bVar17;
  upb_SubCounts *puVar18;
  char *pcVar19;
  uint uVar20;
  ulong uVar21;
  int iVar22;
  ulong uVar23;
  byte *pbVar24;
  bool bVar25;
  bool bVar26;
  upb_LayoutItem item;
  upb_LayoutItem item_00;
  ulong extraout_RDX;
  
  puVar2 = d->table;
  pbVar5 = (byte *)(ptr + len);
  (d->base).end = (char *)pbVar5;
  if ((long)len < 1) {
    if (puVar2 == (upb_MiniTable *)0x0) {
      return ptr;
    }
  }
  else {
    bVar25 = puVar2 != (upb_MiniTable *)0x0;
    puVar14 = (uint *)0x0;
    uVar8 = 0;
    uVar20 = 0;
    pbVar24 = (byte *)ptr;
    do {
      ptr = (char *)(pbVar24 + 1);
      bVar17 = *pbVar24;
      uVar21 = (ulong)(char)bVar17;
      uVar15 = (ulong)bVar17;
      if ((long)uVar21 < 0x4a) {
        if ((d->table == (upb_MiniTable *)0x0) && (puVar14 != (uint *)0x0)) {
          return (char *)pbVar24;
        }
        *field_count = *field_count + 1;
        uVar8 = uVar8 + 1;
        *(uint *)fields = uVar8;
        bVar7 = 0xff;
        if (0xa0 < (byte)(bVar17 + 0x81)) {
          bVar7 = ""[(int)(char)bVar17 - 0x20];
        }
        cVar16 = (d->platform != kUpb_MiniTablePlatform_32Bit) * '\x02' + '\x01';
        if (bVar17 < 0x36) {
          *(undefined1 *)((long)fields + 0xb) = 2;
          *(undefined2 *)((long)fields + 4) = 1;
          if ((bVar7 & 0xfe) != 0x10) {
            if (0x12 < bVar7) goto LAB_00123bae;
            bVar17 = upb_MiniTable_SetField_kUpb_EncodedToFieldRep[bVar7] << 6 | 2;
            *(byte *)((long)fields + 0xb) = bVar17;
            goto LAB_00123a5b;
          }
          bVar17 = cVar16 * '@' | 2;
          *(byte *)((long)fields + 0xb) = bVar17;
LAB_00123a89:
          bVar7 = "\x01\x02\a\x06\x0f\x10\x05\r\x11\x03\x04\x12\x0e\b\f\t\n\v\x0e"[bVar7];
        }
        else {
          bVar7 = bVar7 - 0x14;
          bVar17 = cVar16 * '@' + 1;
          *(byte *)((long)fields + 0xb) = bVar17;
          *(undefined2 *)((long)fields + 4) = 0;
          if (0x12 < bVar7) {
LAB_00123bae:
            uVar15 = (ulong)(uint)(int)(char)bVar7;
            pcVar19 = "Invalid field type: %d";
LAB_00123c1a:
            upb_MdDecoder_ErrorJmp(&d->base,pcVar19,uVar15);
          }
LAB_00123a5b:
          bVar4 = 5;
          if (bVar7 == 0xc) {
LAB_00123a65:
            bVar7 = bVar4;
            bVar17 = bVar17 | 0x10;
            *(byte *)((long)fields + 0xb) = bVar17;
          }
          else {
            if (bVar7 != 0xf) goto LAB_00123a89;
            bVar7 = 9;
            bVar4 = 0xc;
            if ((uVar20 & 1) == 0) goto LAB_00123a65;
          }
        }
        *(byte *)((long)fields + 10) = bVar7;
        if ((((bVar17 & 1) != 0) && ((uVar20 & 2) != 0)) &&
           ((1 << (bVar7 & 0x1f) & 0xffffe1ffU) != 0)) {
          *(byte *)((long)fields + 0xb) = bVar17 | 4;
        }
        puVar18 = sub_counts;
        if (((bVar7 & 0xfe) == 10) ||
           (uVar12 = 0xffff, puVar18 = (upb_SubCounts *)&sub_counts->subenum_count, bVar7 == 0xe)) {
          uVar12 = puVar18->submsg_count;
          puVar18->submsg_count = uVar12 + 1;
        }
        *(uint16_t *)((long)fields + 8) = uVar12;
        puVar11 = (uint *)((long)fields + field_size);
        puVar14 = (uint *)fields;
      }
      else {
        puVar11 = (uint *)fields;
        if ((byte)(bVar17 + 0xb4) < 0x10) {
          for (uVar10 = 0x1f; 0xeU >> uVar10 == 0; uVar10 = uVar10 - 1) {
          }
          uVar13 = 0;
          uVar9 = 0;
          pbVar24 = (byte *)ptr;
          while ((uVar13 = ""[((uint)uVar21 & 0xff) - 0x20] + -0x2a << ((byte)uVar9 & 0x1f) | uVar13
                 , ptr = (char *)pbVar5, pbVar24 != pbVar5 &&
                 (uVar21 = (ulong)*pbVar24, ptr = (char *)pbVar24, 0xef < (byte)(*pbVar24 + 0xa4))))
          {
            pbVar24 = pbVar24 + 1;
            uVar9 = uVar9 + (uVar10 ^ 0xffffffe0) + 0x21;
            if (0x1f < uVar9) goto LAB_00123b86;
          }
          if (puVar14 == (uint *)0x0) {
            uVar20 = uVar13;
            if (d->table == (upb_MiniTable *)0x0) {
              pcVar19 = "Extensions cannot have message modifiers";
              goto LAB_00123b90;
            }
          }
          else {
            if ((uVar13 & 1) != 0) {
              if (((*(byte *)((long)puVar14 + 0xb) & 1) == 0) ||
                 ((0xffffe1ffU >> (*(byte *)((long)puVar14 + 10) & 0x1f) & 1) == 0)) {
                uVar15 = (ulong)*puVar14;
                pcVar19 = "Cannot flip packed on unpackable field %u";
                goto LAB_00123c1a;
              }
              *(byte *)((long)puVar14 + 0xb) = *(byte *)((long)puVar14 + 0xb) ^ 4;
            }
            if ((uVar13 & 8) != 0) {
              if ((*(char *)((long)puVar14 + 10) != '\f') ||
                 ((*(byte *)((long)puVar14 + 0xb) & 0x10) == 0)) {
                upb_MdDecoder_ErrorJmp
                          (&d->base,"Cannot flip ValidateUtf8 on field %u, type=%d, mode=%d",
                           (ulong)*puVar14);
              }
              *(undefined1 *)((long)puVar14 + 10) = 9;
              *(byte *)((long)puVar14 + 0xb) = *(byte *)((long)puVar14 + 0xb) & 0xef;
            }
            if ((uVar13 & 6) != 0) {
              if ((short)puVar14[1] != 1) {
                uVar15 = (ulong)*puVar14;
                pcVar19 = "Invalid modifier(s) for repeated field %u";
                goto LAB_00123c1a;
              }
              if ((uVar13 & 6) == 6) {
                uVar15 = (ulong)*puVar14;
                pcVar19 = "Field %u cannot be both singular and required";
                goto LAB_00123c1a;
              }
              if ((uVar13 & 4) != 0) {
                if ((*(byte *)((long)puVar14 + 10) & 0xfe) == 10) {
                  uVar15 = (ulong)*puVar14;
                  pcVar19 = "Field %u cannot be a singular submessage";
                  goto LAB_00123c1a;
                }
                *(undefined2 *)(puVar14 + 1) = 0;
              }
              if ((uVar13 & 2) != 0) {
                *(undefined2 *)(puVar14 + 1) = 2;
              }
            }
          }
          if ((uVar20 & 4) != 0) {
            puVar1 = &d->table->ext_dont_copy_me__upb_internal_use_only;
            *puVar1 = *puVar1 | 1;
          }
        }
        else if (bVar17 == 0x5e) {
          if (d->table == (upb_MiniTable *)0x0) {
            pcVar19 = "Extensions cannot have oneofs.";
            goto LAB_00123b90;
          }
          uVar21 = 0xffff;
          if (ptr < pbVar5) {
            uVar21 = 0xffff;
            uVar23 = 0;
            do {
              bVar17 = *ptr;
              pbVar24 = (byte *)ptr + 1;
              ptr = (char *)pbVar24;
              if (bVar17 != 0x7c) {
                if (bVar17 != 0x7e) {
                  for (uVar10 = 0x1f; 0x3eU >> uVar10 == 0; uVar10 = uVar10 - 1) {
                  }
                  uVar13 = 0;
                  uVar9 = 0;
                  while( true ) {
                    iVar22 = -1;
                    if (0xa0 < (byte)(bVar17 + 0x81)) {
                      iVar22 = (int)""[bVar17 - 0x20];
                    }
                    uVar13 = uVar13 | iVar22 << ((byte)uVar9 & 0x1f);
                    ptr = (char *)pbVar5;
                    if ((pbVar24 == pbVar5) ||
                       (bVar17 = *pbVar24, ptr = (char *)pbVar24, (byte)(bVar17 + 0x9d) < 0xbd))
                    break;
                    pbVar24 = pbVar24 + 1;
                    uVar9 = uVar9 + (uVar10 ^ 0xffffffe0) + 0x21;
                    if (0x1f < uVar9) {
                      pcVar19 = "Overlong varint";
                      goto LAB_00123b90;
                    }
                  }
                  puVar6 = upb_MiniTable_FindFieldByNumber(d->table,uVar13);
                  if (puVar6 == (upb_MiniTableField *)0x0) {
                    pcVar19 = "Couldn\'t add field number %u to oneof, no such field number.";
                  }
                  else {
                    if (puVar6->offset_dont_copy_me__upb_internal_use_only == 1) {
                      bVar17 = puVar6->mode_dont_copy_me__upb_internal_use_only >> 6;
                      uVar10 = (uint)bVar17;
                      bVar26 = d->platform == kUpb_MiniTablePlatform_32Bit;
                      pbVar5 = &upb_MtDecoder_SizeOfRep_kRepToSize64 + bVar17;
                      if (bVar26) {
                        pbVar5 = &upb_MtDecoder_AlignOfRep_kRepToAlign64 + bVar17;
                      }
                      uVar15 = CONCAT71((int7)((ulong)(&upb_MtDecoder_AlignOfRep_kRepToAlign64 +
                                                      bVar17) >> 8),*pbVar5);
                      puVar3 = &upb_MtDecoder_SizeOfRep_kRepToSize64;
                      if (bVar26) {
                        puVar3 = &upb_MtDecoder_AlignOfRep_kRepToAlign64;
                      }
                      if (*pbVar5 <= (byte)puVar3[uVar23]) {
                        uVar10 = (uint)uVar23;
                      }
                      puVar6->offset_dont_copy_me__upb_internal_use_only = (uint16_t)uVar21;
                      uVar21 = (ulong)(((uint)((int)puVar6 - *(int *)&d->fields) >> 2) * -0x5555 + 3
                                      );
                      uVar23 = (ulong)uVar10;
                      goto LAB_0012385c;
                    }
                    pcVar19 = "Cannot add repeated, required, or singular field %u to oneof.";
                  }
                  uVar15 = (ulong)uVar13;
                  goto LAB_00123c1a;
                }
                item._0_8_ = uVar21 & 0xffff | uVar23 << 0x20;
                item.type = (upb_LayoutItemType)uVar15;
                upb_MtDecoder_PushOneof(d,item);
                uVar21 = 0xffff;
                uVar15 = extraout_RDX;
              }
LAB_0012385c:
              pbVar5 = (byte *)(d->base).end;
            } while (ptr < pbVar5);
            uVar21 = uVar21 & 0xffff | uVar23 << 0x20;
          }
          item_00.type = (upb_LayoutItemType)uVar15;
          item_00.field_index = (short)uVar21;
          item_00.offset = (short)(uVar21 >> 0x10);
          item_00.rep = (int)(uVar21 >> 0x20);
          upb_MtDecoder_PushOneof(d,item_00);
          pbVar5 = (byte *)(d->base).end;
        }
        else {
          if (0x1f < (byte)(bVar17 + 0xa1)) {
            pcVar19 = "Invalid char: %c";
            goto LAB_00123c1a;
          }
          if (bVar25) {
            d->table->dense_below_dont_copy_me__upb_internal_use_only =
                 (uint8_t)d->table->field_count_dont_copy_me__upb_internal_use_only;
            bVar25 = false;
          }
          for (uVar10 = 0x1f; 0x1eU >> uVar10 == 0; uVar10 = uVar10 - 1) {
          }
          uVar13 = 0;
          uVar9 = 0;
          while ((uVar13 = ""[((uint)uVar21 & 0xff) - 0x20] + -0x3c << ((byte)uVar9 & 0x1f) | uVar13
                 , pbVar24 = pbVar5, (byte *)ptr != pbVar5 &&
                 (uVar21 = (ulong)(byte)*ptr, pbVar24 = (byte *)ptr, 0xdf < (byte)(*ptr + 0x81U))))
          {
            ptr = (char *)((byte *)ptr + 1);
            uVar9 = uVar9 + (uVar10 ^ 0xffffffe0) + 0x21;
            if (0x1f < uVar9) goto LAB_00123b86;
          }
          ptr = (char *)pbVar24;
          uVar8 = (uVar8 + uVar13) - 1;
        }
      }
      pbVar24 = (byte *)ptr;
      fields = puVar11;
    } while (ptr < pbVar5);
    if (!bVar25) {
      return (char *)(byte *)ptr;
    }
  }
  d->table->dense_below_dont_copy_me__upb_internal_use_only =
       (uint8_t)d->table->field_count_dont_copy_me__upb_internal_use_only;
  return (char *)(byte *)ptr;
LAB_00123b86:
  pcVar19 = "Overlong varint";
LAB_00123b90:
  upb_MdDecoder_ErrorJmp(&d->base,pcVar19);
}

Assistant:

static const char* upb_MtDecoder_Parse(upb_MtDecoder* d, const char* ptr,
                                       size_t len, void* fields,
                                       size_t field_size, uint16_t* field_count,
                                       upb_SubCounts* sub_counts) {
  uint64_t msg_modifiers = 0;
  uint32_t last_field_number = 0;
  upb_MiniTableField* last_field = NULL;
  bool need_dense_below = d->table != NULL;

  d->base.end = UPB_PTRADD(ptr, len);

  while (ptr < d->base.end) {
    char ch = *ptr++;
    if (ch <= kUpb_EncodedValue_MaxField) {
      if (!d->table && last_field) {
        // For extensions, consume only a single field and then return.
        return --ptr;
      }
      upb_MiniTableField* field = fields;
      *field_count += 1;
      fields = (char*)fields + field_size;
      field->UPB_PRIVATE(number) = ++last_field_number;
      last_field = field;
      upb_MiniTable_SetField(d, ch, field, msg_modifiers, sub_counts);
    } else if (kUpb_EncodedValue_MinModifier <= ch &&
               ch <= kUpb_EncodedValue_MaxModifier) {
      ptr = upb_MtDecoder_ParseModifier(d, ptr, ch, last_field, &msg_modifiers);
      if (msg_modifiers & kUpb_MessageModifier_IsExtendable) {
        d->table->UPB_PRIVATE(ext) |= kUpb_ExtMode_Extendable;
      }
    } else if (ch == kUpb_EncodedValue_End) {
      if (!d->table) {
        upb_MdDecoder_ErrorJmp(&d->base, "Extensions cannot have oneofs.");
      }
      ptr = upb_MtDecoder_DecodeOneofs(d, ptr);
    } else if (kUpb_EncodedValue_MinSkip <= ch &&
               ch <= kUpb_EncodedValue_MaxSkip) {
      if (need_dense_below) {
        d->table->UPB_PRIVATE(dense_below) = d->table->UPB_PRIVATE(field_count);
        need_dense_below = false;
      }
      uint32_t skip;
      ptr = upb_MdDecoder_DecodeBase92Varint(&d->base, ptr, ch,
                                             kUpb_EncodedValue_MinSkip,
                                             kUpb_EncodedValue_MaxSkip, &skip);
      last_field_number += skip;
      last_field_number--;  // Next field seen will increment.
    } else {
      upb_MdDecoder_ErrorJmp(&d->base, "Invalid char: %c", ch);
    }
  }

  if (need_dense_below) {
    d->table->UPB_PRIVATE(dense_below) = d->table->UPB_PRIVATE(field_count);
  }

  return ptr;
}